

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O0

SchnorrVerifyRequest * __thiscall
cfd::js::api::json::SchnorrVerifyRequest::GetPubkeyString_abi_cxx11_
          (SchnorrVerifyRequest *this,SchnorrVerifyRequest *obj)

{
  SchnorrVerifyRequest *obj_local;
  
  core::ConvertToString<std::__cxx11::string>((core *)this,&obj->pubkey_);
  return this;
}

Assistant:

static std::string GetPubkeyString(  // line separate
      const SchnorrVerifyRequest& obj) {  // NOLINT
    return cfd::core::ConvertToString(obj.pubkey_);
  }